

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O0

void testDefault(TA_FuncInfo *funcInfo,void *opaqueData)

{
  int iVar1;
  ErrorNumber EVar2;
  TA_FuncInfo *in_RSI;
  undefined8 *in_RDI;
  ErrorNumber *errorNumber;
  int in_stack_00000094;
  int *in_stack_00000098;
  double *in_stack_000000a0;
  char *in_stack_000000a8;
  ProfilingType in_stack_000000e4;
  char *in_stack_000000e8;
  
  if (*(int *)&in_RSI->name != 0) {
    return;
  }
  iVar1 = isMath(in_RSI);
  if (iVar1 == 0) {
    EVar2 = callWithDefaults(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094
                            );
    *(ErrorNumber *)&in_RSI->name = EVar2;
    if (*(int *)&in_RSI->name != 0) {
      printf("Failed for [%s][%s]\n",*in_RDI,"inputNegData");
      return;
    }
    EVar2 = callWithDefaults(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094
                            );
    *(ErrorNumber *)&in_RSI->name = EVar2;
    if (*(int *)&in_RSI->name != 0) {
      printf("Failed for [%s][%s]\n",*in_RDI,"inputZeroData");
      return;
    }
    EVar2 = callWithDefaults(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094
                            );
    *(ErrorNumber *)&in_RSI->name = EVar2;
    if (*(int *)&in_RSI->name != 0) {
      printf("Failed for [%s][%s]\n",*in_RDI,"inputRandFltEpsilon");
      return;
    }
    EVar2 = callWithDefaults(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094
                            );
    *(ErrorNumber *)&in_RSI->name = EVar2;
    if (*(int *)&in_RSI->name != 0) {
      printf("Failed for [%s][%s]\n",*in_RDI,"inputRandDblEpsilon");
      return;
    }
  }
  EVar2 = callWithDefaults(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  *(ErrorNumber *)&in_RSI->name = EVar2;
  if (*(int *)&in_RSI->name == 0) {
    if (doExtensiveProfiling != 0) {
      testDefault::nbFunctionDone = testDefault::nbFunctionDone + 1;
      printf("%s ",*in_RDI);
      EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
      *(ErrorNumber *)&in_RSI->name = EVar2;
      if (*(int *)&in_RSI->name == 0) {
        EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
        *(ErrorNumber *)&in_RSI->name = EVar2;
        if (*(int *)&in_RSI->name == 0) {
          EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
          *(ErrorNumber *)&in_RSI->name = EVar2;
          if (*(int *)&in_RSI->name == 0) {
            EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
            *(ErrorNumber *)&in_RSI->name = EVar2;
            if (*(int *)&in_RSI->name == 0) {
              EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
              *(ErrorNumber *)&in_RSI->name = EVar2;
              if (*(int *)&in_RSI->name == 0) {
                EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
                *(ErrorNumber *)&in_RSI->name = EVar2;
                if (*(int *)&in_RSI->name == 0) {
                  EVar2 = callAndProfile(in_stack_000000e8,in_stack_000000e4);
                  *(ErrorNumber *)&in_RSI->name = EVar2;
                  if (*(int *)&in_RSI->name == 0) {
                    printf("\n");
                  }
                  else {
                    printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_10000");
                  }
                }
                else {
                  printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_8000");
                }
              }
              else {
                printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_5000");
              }
            }
            else {
              printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_2000");
            }
          }
          else {
            printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_1000");
          }
        }
        else {
          printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_500");
        }
      }
      else {
        printf("Failed for [%s][%s]\n",*in_RDI,"PROFILING_100");
      }
    }
  }
  else {
    printf("Failed for [%s][%s]\n",*in_RDI,"inputRandomData");
  }
  return;
}

Assistant:

static void testDefault( const TA_FuncInfo *funcInfo, void *opaqueData )
{
	static int nbFunctionDone = 0;
   ErrorNumber *errorNumber;
   errorNumber = (ErrorNumber *)opaqueData;
   if( *errorNumber != TA_TEST_PASS )
      return;

/*   if( !isCandlePattern(funcInfo) )
	   return;*/

#define CALL(x) { \
	*errorNumber = callWithDefaults( funcInfo->name, x, x##_int, sizeof(x)/sizeof(double) ); \
	if( *errorNumber != TA_TEST_PASS ) { \
	   printf( "Failed for [%s][%s]\n", funcInfo->name, #x ); \
       return; \
	} \
}
   /* Do not test value outside the ]0..1[ domain for the "Math" groups. */
   if( !isMath(funcInfo) )
   {
      CALL( inputNegData );
      CALL( inputZeroData );
      CALL( inputRandFltEpsilon );
      CALL( inputRandDblEpsilon );
   }

   CALL( inputRandomData );

#undef CALL

#define CALL(x) { \
	*errorNumber = callAndProfile( funcInfo->name, x ); \
	if( *errorNumber != TA_TEST_PASS ) { \
	   printf( "Failed for [%s][%s]\n", funcInfo->name, #x ); \
       return; \
	} \
}
   if( doExtensiveProfiling /*&& (nbFunctionDone<5)*/ )
   {
	   nbFunctionDone++;
	   printf( "%s ", funcInfo->name );
       CALL( PROFILING_100 );
       CALL( PROFILING_500 );
	   CALL( PROFILING_1000 );
       CALL( PROFILING_2000 );
       CALL( PROFILING_5000 );
       CALL( PROFILING_8000 );
	   CALL( PROFILING_10000 );
	   printf( "\n" );
   }
}